

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution1d.cpp
# Opt level: O0

int __thiscall embree::Distribution1D::init(Distribution1D *this,EVP_PKEY_CTX *ctx)

{
  reference pvVar1;
  size_t in_RDX;
  float fVar2;
  undefined1 auVar3 [16];
  size_t i_1;
  float rcpSum;
  size_t i;
  __m128 r;
  __m128 a;
  float local_13c;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  ulong local_128;
  ulong local_118;
  float local_38;
  
  this->size = in_RDX;
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)this,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)this,
             CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,0);
  *pvVar1 = 0.0;
  for (local_118 = 1; local_118 < this->size + 1; local_118 = local_118 + 1) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,local_118 - 1);
    fVar2 = *pvVar1 + *(float *)(ctx + (local_118 - 1) * 4);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,local_118);
    *pvVar1 = fVar2;
  }
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,this->size);
  if ((*pvVar1 != 0.0) || (NAN(*pvVar1))) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,this->size);
    fVar2 = *pvVar1;
    auVar3 = rcpss(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
    local_38 = auVar3._0_4_;
    local_38 = local_38 * (2.0 - local_38 * fVar2);
  }
  else {
    local_38 = 0.0;
  }
  for (local_128 = 1; local_128 < this->size + 1; local_128 = local_128 + 1) {
    fVar2 = *(float *)(ctx + local_128 * 4 + -4);
    local_13c = (float)this->size;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->PDF,local_128 - 1);
    *pvVar1 = fVar2 * local_38 * local_13c;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,local_128);
    *pvVar1 = local_38 * *pvVar1;
  }
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&this->CDF,this->size);
  *pvVar1 = 1.0;
  return (int)pvVar1;
}

Assistant:

void Distribution1D::init(const float* f, const size_t size_in)
  {
    /*! create arrays */
    size = size_in;
    PDF.resize(size);
    CDF.resize(size+1);

    /*! accumulate the function f */
    CDF[0] = 0.0f;
    for (size_t i=1; i<size+1; i++)
      CDF[i] = CDF[i-1] + f[i-1];

    /*! compute reciprocal sum */
    float rcpSum = CDF[size] == 0.0f ? 0.0f : rcp(CDF[size]);

    /*! normalize the probability distribution and cumulative distribution */
    for (size_t i = 1; i<size+1; i++) {
      PDF[i-1] = f[i-1] * rcpSum * size;
      CDF[i] *= rcpSum;
    }
    CDF[size] = 1.0f;
  }